

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

void nhr_response_parse_content_length(nhr_response r,char *received)

{
  int iVar1;
  char *pcVar2;
  char *value;
  unsigned_long length;
  char *received_local;
  nhr_response r_local;
  
  value = (char *)0x0;
  length = (unsigned_long)received;
  received_local = (char *)r;
  pcVar2 = nhr_response_find_http_field_value(received,k_nhr_content_length);
  if (((pcVar2 != (char *)0x0) && (iVar1 = __isoc99_sscanf(pcVar2,"%lu",&value), iVar1 == 1)) &&
     (value != (char *)0x0)) {
    *(char **)(received_local + 0x18) = value;
  }
  return;
}

Assistant:

void nhr_response_parse_content_length(nhr_response r, char * received) {
	unsigned long length = 0;
	char * value = nhr_response_find_http_field_value(received, k_nhr_content_length);
	if (!value) {
		return;
	}

	if (nhr_sscanf(value, "%lu", &length) == 1 && length > 0) {
		r->content_length = (size_t)length;
	}
}